

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTextureClampTests.cpp
# Opt level: O2

string * __thiscall
gl4cts::SparseTextureClampLookupColorTestCase::generateExpectedResult
          (string *__return_storage_ptr__,SparseTextureClampLookupColorTestCase *this,
          string *returnType,GLint level)

{
  bool bVar1;
  allocator<char> local_96;
  allocator<char> local_95;
  float local_94;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  bVar1 = std::operator==(returnType,"vec4");
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"(",&local_95);
    local_94 = (float)level / 10.0 + 0.5;
    de::toString<float>(&local_70,&local_94);
    std::operator+(&local_30,&local_50,&local_70);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,", 0, 0, 1)",&local_96);
    std::operator+(__return_storage_ptr__,&local_30,&local_90);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"(",&local_95);
    local_94 = (float)(level * 10);
    de::toString<int>(&local_70,(int *)&local_94);
    std::operator+(&local_30,&local_50,&local_70);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,", 0, 0, 1)",&local_96);
    std::operator+(__return_storage_ptr__,&local_30,&local_90);
  }
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string SparseTextureClampLookupColorTestCase::generateExpectedResult(std::string returnType, GLint level)
{
	if (returnType == "vec4")
		return std::string("(") + de::toString(0.5f + (float)level / 10) + std::string(", 0, 0, 1)");
	else
		return std::string("(") + de::toString(level * 10) + std::string(", 0, 0, 1)");
}